

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor_rational.hpp
# Opt level: O0

int __thiscall
soplex::CLUFactorRational::solveLleft(CLUFactorRational *this,Rational *vec,int *nonz,int rn)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  bool bVar5;
  undefined1 uVar6;
  int in_ECX;
  int iVar7;
  int *piVar8;
  int *in_RDX;
  int *piVar9;
  long in_RSI;
  long in_RDI;
  int m;
  VectorRational *rval;
  int *last;
  int *rperm;
  int *rorig;
  int *rbeg;
  int *idx;
  int *ridx;
  Rational *val;
  Rational y;
  Rational x;
  int r;
  int n;
  int k;
  int j;
  int i;
  undefined4 in_stack_fffffffffffffe28;
  int in_stack_fffffffffffffe2c;
  undefined4 in_stack_fffffffffffffe30;
  undefined2 in_stack_fffffffffffffe34;
  undefined1 in_stack_fffffffffffffe36;
  undefined1 in_stack_fffffffffffffe37;
  expression<boost::multiprecision::detail::multiply_immediates,_boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_void,_void>
  *in_stack_fffffffffffffe38;
  undefined7 in_stack_fffffffffffffe40;
  undefined4 in_stack_fffffffffffffe50;
  undefined4 in_stack_fffffffffffffe54;
  expression<boost::multiprecision::detail::negate,_boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_void,_void,_void>
  *in_stack_fffffffffffffe58;
  int *local_160;
  int *local_140;
  undefined1 local_118 [64];
  undefined1 local_d8 [64];
  int local_98;
  int local_94;
  int local_90;
  int local_8c;
  int local_88;
  int local_84;
  int *local_80;
  long local_78;
  undefined1 *local_68;
  undefined1 *local_60;
  undefined1 *local_58;
  long local_50;
  undefined1 *local_48;
  long local_40;
  long local_38;
  undefined1 *local_30;
  long local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  long local_10;
  undefined1 *local_8;
  
  local_68 = local_d8;
  local_84 = in_ECX;
  local_80 = in_RDX;
  local_78 = in_RSI;
  boost::multiprecision::backends::
  rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
  ::rational_adaptor((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                      *)0x226e30);
  local_60 = local_118;
  boost::multiprecision::backends::
  rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
  ::rational_adaptor((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                      *)0x226e4d);
  lVar1 = *(long *)(in_RDI + 0x128);
  lVar2 = *(long *)(in_RDI + 0x130);
  lVar3 = *(long *)(in_RDI + 0x138);
  lVar4 = *(long *)(in_RDI + 0x140);
  local_94 = 0;
  local_88 = 0;
  while (local_88 < local_84) {
    enQueueMaxRat(local_80,&local_88,*(int *)(lVar4 + (long)local_80[local_88] * 4));
  }
  local_160 = local_80 + *(int *)(in_RDI + 4);
  while (0 < local_84) {
    local_88 = deQueueMaxRat(local_80,&local_84);
    local_98 = *(int *)(lVar3 + (long)local_88 * 4);
    local_28 = local_78 + (long)local_98 * 0x40;
    local_20 = local_d8;
    boost::multiprecision::backends::
    rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
    ::operator=((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                 *)CONCAT17(in_stack_fffffffffffffe37,
                            CONCAT16(in_stack_fffffffffffffe36,
                                     CONCAT24(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30)))
                ,(rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                  *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
    uVar6 = boost::multiprecision::operator!=
                      ((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                        *)in_stack_fffffffffffffe38,
                       (int *)CONCAT17(in_stack_fffffffffffffe37,
                                       CONCAT16(in_stack_fffffffffffffe36,
                                                CONCAT24(in_stack_fffffffffffffe34,
                                                         in_stack_fffffffffffffe30))));
    if ((bool)uVar6) {
      piVar9 = local_160 + -1;
      local_160[-1] = local_98;
      local_94 = local_94 + 1;
      local_90 = *(int *)(lVar2 + (long)local_98 * 4);
      local_8c = *(int *)(lVar2 + 4 + (long)local_98 * 4) - local_90;
      in_stack_fffffffffffffe38 =
           (expression<boost::multiprecision::detail::multiply_immediates,_boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_void,_void>
            *)VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
              ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                            *)CONCAT17(in_stack_fffffffffffffe37,
                                       CONCAT16(in_stack_fffffffffffffe36,
                                                CONCAT24(in_stack_fffffffffffffe34,
                                                         in_stack_fffffffffffffe30))),
                           in_stack_fffffffffffffe2c);
      local_140 = (int *)(lVar1 + (long)local_90 * 4);
      while (iVar7 = local_8c + -1, bVar5 = 0 < local_8c, local_160 = piVar9, local_8c = iVar7,
            bVar5) {
        piVar8 = local_140 + 1;
        iVar7 = *local_140;
        local_38 = local_78 + (long)iVar7 * 0x40;
        local_30 = local_118;
        boost::multiprecision::backends::
        rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
        ::operator=((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                     *)CONCAT17(in_stack_fffffffffffffe37,
                                CONCAT16(in_stack_fffffffffffffe36,
                                         CONCAT24(in_stack_fffffffffffffe34,
                                                  in_stack_fffffffffffffe30))),
                    (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                     *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
        in_stack_fffffffffffffe37 =
             boost::multiprecision::operator==
                       ((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                         *)in_stack_fffffffffffffe38,
                        (int *)CONCAT17(in_stack_fffffffffffffe37,
                                        CONCAT16(in_stack_fffffffffffffe36,
                                                 CONCAT24(in_stack_fffffffffffffe34,
                                                          in_stack_fffffffffffffe30))));
        local_140 = piVar8;
        if ((bool)in_stack_fffffffffffffe37) {
          boost::multiprecision::operator-
                    ((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                      *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
          boost::multiprecision::operator*
                    (in_stack_fffffffffffffe58,
                     (number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                      *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50));
          boost::multiprecision::
          number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>
          ::operator=((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                       *)CONCAT17(uVar6,in_stack_fffffffffffffe40),
                      (expression<boost::multiprecision::detail::negate,_boost::multiprecision::detail::expression<boost::multiprecision::detail::multiply_immediates,_boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_void,_void>,_void,_void,_void>
                       *)in_stack_fffffffffffffe38);
          in_stack_fffffffffffffe36 =
               boost::multiprecision::operator!=
                         ((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                           *)in_stack_fffffffffffffe38,
                          (int *)CONCAT17(in_stack_fffffffffffffe37,
                                          CONCAT16(in_stack_fffffffffffffe36,
                                                   CONCAT24(in_stack_fffffffffffffe34,
                                                            in_stack_fffffffffffffe30))));
          if ((bool)in_stack_fffffffffffffe36) {
            local_40 = local_78 + (long)iVar7 * 0x40;
            local_48 = local_118;
            boost::multiprecision::backends::
            rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
            ::operator=((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                         *)CONCAT17(in_stack_fffffffffffffe37,
                                    CONCAT16(in_stack_fffffffffffffe36,
                                             CONCAT24(in_stack_fffffffffffffe34,
                                                      in_stack_fffffffffffffe30))),
                        (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                         *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
            enQueueMaxRat(local_80,&local_84,*(int *)(lVar4 + (long)iVar7 * 4));
          }
        }
        else {
          boost::multiprecision::operator*
                    ((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                      *)in_stack_fffffffffffffe38,
                     (number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                      *)CONCAT17(in_stack_fffffffffffffe37,
                                 CONCAT16(in_stack_fffffffffffffe36,
                                          CONCAT24(in_stack_fffffffffffffe34,
                                                   in_stack_fffffffffffffe30))));
          boost::multiprecision::
          number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>
          ::operator-=((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                        *)CONCAT17(uVar6,in_stack_fffffffffffffe40),in_stack_fffffffffffffe38);
          local_50 = local_78 + (long)iVar7 * 0x40;
          local_58 = local_118;
          boost::multiprecision::backends::
          rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
          ::operator=((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                       *)CONCAT17(in_stack_fffffffffffffe37,
                                  CONCAT16(in_stack_fffffffffffffe36,
                                           CONCAT24(in_stack_fffffffffffffe34,
                                                    in_stack_fffffffffffffe30))),
                      (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                       *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
        }
      }
    }
    else {
      in_stack_fffffffffffffe54 = 0;
      local_10 = local_78 + (long)local_98 * 0x40;
      local_18 = &stack0xfffffffffffffe54;
      local_8 = local_18;
      boost::multiprecision::backends::
      rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
      ::operator=((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                   *)CONCAT17(in_stack_fffffffffffffe37,
                              CONCAT16(in_stack_fffffffffffffe36,
                                       CONCAT24(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30)
                                      )),
                  CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
    }
  }
  for (local_88 = 0; local_88 < local_94; local_88 = local_88 + 1) {
    *local_80 = *local_160;
    local_160 = local_160 + 1;
    local_80 = local_80 + 1;
  }
  iVar7 = local_94;
  boost::multiprecision::
  number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
  ::~number((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
             *)0x2273d2);
  boost::multiprecision::
  number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
  ::~number((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
             *)0x2273df);
  return iVar7;
}

Assistant:

inline int CLUFactorRational::solveLleft(Rational* vec, int* nonz, int rn)
{
   int i, j, k, n;
   int r;
   Rational x, y;
   Rational* val;
   int* ridx, *idx;
   int* rbeg;
   int* rorig, *rperm;
   int* last;

   ridx  = l.ridx;
   VectorRational& rval  = l.rval;
   rbeg  = l.rbeg;
   rorig = l.rorig;
   rperm = l.rperm;
   n     = 0;

   i = l.firstUpdate - 1;
#ifndef SOPLEX_WITH_L_ROWS
#pragma warn "Not yet implemented, define SOPLEX_WITH_L_ROWS"
   VectorRational& lval = l.val;
   int*    lidx = l.idx;
   int*    lrow = l.row;
   int*    lbeg = l.start;

   for(; i >= 0; --i)
   {
      k   = lbeg[i];
      val = &lval[k];
      idx = &lidx[k];
      x   = 0;

      for(j = lbeg[i + 1]; j > k; --j)
         x += vec[*idx++] * (*val++);

      vec[lrow[i]] -= x;
   }

#else

   /*  move rhsidx to a heap
    */
   for(i = 0; i < rn;)
      enQueueMaxRat(nonz, &i, rperm[nonz[i]]);

   last = nonz + thedim;

   while(rn > 0)
   {
      i = deQueueMaxRat(nonz, &rn);
      r = rorig[i];
      x = vec[r];

      if(x != 0)
      {
         *(--last) = r;
         n++;
         k = rbeg[r];
         j = rbeg[r + 1] - k;
         val = &rval[k];
         idx = &ridx[k];

         while(j-- > 0)
         {
            assert(l.rperm[*idx] < i);
            int m = *idx++;
            y = vec[m];

            if(y == 0)
            {
               y = -x * *val++;

               if(y != 0)
               {
                  vec[m] = y;
                  enQueueMaxRat(nonz, &rn, rperm[m]);
               }
            }
            else
            {
               y -= x * *val++;
               //               vec[m] = ( y != 0 ) ? y : SOPLEX_MARKER;
               vec[m] = y;
            }
         }
      }
      else
         vec[r] = 0;
   }

   for(i = 0; i < n; ++i)
      *nonz++ = *last++;

#endif

   return n;
}